

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U>::SmallDenseMap
          (SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this,
          Allocator *allocator)

{
  Node *local_20;
  Allocator *allocator_local;
  SmallDenseMap<InplaceStr,_VariableData_*,_InplaceStrHasher,_128U> *this_local;
  
  local_20 = this->storage;
  do {
    Node::Node(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (Node *)&this->allocator);
  this->allocator = allocator;
  this->bucketCount = 0x80;
  this->count = 0;
  this->data = this->storage;
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount * 0x18);
  return;
}

Assistant:

SmallDenseMap(Allocator *allocator = 0): allocator(allocator)
	{
		assert(N >= 2 && "size is too small");
		assert((N & (N - 1)) == 0 && "only power of 2 sizes are supported");

		bucketCount = N;

		count = 0;

		data = storage;

		NULLC::fillMemory(data, 0, sizeof(Node) * bucketCount);
	}